

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O1

void Abc_SclObjMarkFanFans(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  
  if ((pObj->field_0x14 & 0x20) != 0) {
    return;
  }
  uVar1 = vNodes->nCap;
  if (vNodes->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_004754a1;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
      }
      vNodes->pArray = ppvVar2;
    }
    vNodes->nCap = iVar3;
  }
LAB_004754a1:
  iVar3 = vNodes->nSize;
  vNodes->nSize = iVar3 + 1;
  vNodes->pArray[iVar3] = pObj;
  pObj->field_0x14 = pObj->field_0x14 | 0x20;
  return;
}

Assistant:

void Abc_SclObjMarkFanFans( Abc_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
//    Abc_Obj_t * pNext;
//    int i;
    if ( pObj->fMarkB == 0 )
    {
        Vec_PtrPush( vNodes, pObj );
        pObj->fMarkB = 1;
    }
/*
    Abc_ObjForEachFanin( pObj, pNext, i )
        if ( pNext->fMarkB == 0 )
        {
            Vec_PtrPush( vNodes, pNext );
            pNext->fMarkB = 1;
        }
    Abc_ObjForEachFanout( pObj, pNext, i )
        if ( pNext->fMarkB == 0 )
        {
            Vec_PtrPush( vNodes, pNext );
            pNext->fMarkB = 1;
        }
*/
}